

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

void __thiscall
QtMWidgets::PageControlPrivate::updateButtonGeometryForLine(PageControlPrivate *this,int line)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  reference pQVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  iVar1 = this->buttonSize;
  uVar2 = this->countInOneLine;
  uVar5 = uVar2;
  if (this->linesCount + -1 == line) {
    uVar5 = this->countInLastLine;
  }
  iVar3 = this->widgetWidth;
  uVar8 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar8;
  }
  for (; (int)uVar6 != (int)uVar8; uVar8 = uVar8 + 1) {
    iVar7 = this->buttonSize * (int)uVar8 + (int)(iVar3 - iVar1 * uVar5) / 2;
    pQVar4 = QList<QRect>::operator[](&this->rectangles,(long)(int)(uVar2 * line) + uVar8);
    pQVar4->x1 = iVar7;
    pQVar4->y1 = line * iVar1;
    pQVar4->x2 = iVar1 + -2 + iVar7;
    pQVar4->y2 = iVar1 + line * iVar1 + -2;
  }
  return;
}

Assistant:

void
PageControlPrivate::updateButtonGeometryForLine( int line )
{
	int count = countInOneLine;

	if( line == linesCount - 1 )
		count = countInLastLine;

	int index = line * countInOneLine;

	const int offset = ( widgetWidth - count * buttonSize ) / 2;

	const int y = line * buttonSize;

	const int size = buttonSize - 1;

	for( int i = 0; i < count; ++i )
	{
		rectangles[ index ] = QRect( offset + i * buttonSize, y,
			size, size );

		++index;
	}
}